

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::ComputeLinkImplementationLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkImplementation *impl,
          cmGeneratorTarget *head)

{
  cmTarget *pcVar1;
  size_type sVar2;
  bool bVar3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar4;
  size_type __n;
  int iVar5;
  int iVar6;
  PolicyStatus PVar7;
  char *pcVar8;
  ostream *poVar9;
  cmake *pcVar10;
  _Rb_tree_node_base *p_Var11;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  cmGeneratorTarget *pcVar13;
  PolicyID id;
  pointer item;
  pointer item_00;
  cmTargetLinkLibraryType cVar14;
  MessageType t;
  bool bVar15;
  cmStringRange cVar16;
  cmBacktraceRange cVar17;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  llibs;
  string evaluated;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  ostringstream e;
  cmGeneratorExpressionDAGChecker dagChecker;
  auto_ptr<cmCompiledGeneratorExpression> local_3c0;
  const_iterator local_3b8;
  cmOptionalLinkImplementation *local_3b0;
  cmListFileBacktrace *local_3a8;
  string *local_3a0;
  string local_398;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  string local_358;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_338;
  const_iterator local_330;
  cmGeneratorTarget *local_328;
  PolicyMap *local_320;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_318;
  string local_310;
  cmListFileBacktrace local_2f0;
  cmGeneratorExpression local_2b0;
  undefined1 local_270 [32];
  cmGeneratorTarget *local_250;
  cmListFileBacktrace local_248;
  ios_base local_200 [264];
  undefined1 local_f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_b0;
  cmListFileBacktrace local_78;
  
  local_3b0 = impl;
  local_3a0 = config;
  local_328 = head;
  cVar16 = cmTarget::GetLinkImplementationEntries_abi_cxx11_(this->Target);
  cVar17 = cmTarget::GetLinkImplementationBacktraces(this->Target);
  local_3a8 = (cmListFileBacktrace *)cVar17.Begin._M_current;
  if (cVar16.Begin._M_current._M_current != cVar16.End._M_current._M_current) {
    local_320 = &this->PolicyMap;
    local_318 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)&this->LinkImplicitNullProperties;
    local_338 = &this->MaxLanguageStandards;
    do {
      local_330 = cVar16.End._M_current;
      local_3b8 = cVar16.Begin._M_current;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar1 = this->Target;
      local_270._0_8_ = local_270 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"LINK_LIBRARIES","");
      cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                ((cmGeneratorExpressionDAGChecker *)local_f8,&pcVar1->Name,(string *)local_270,
                 (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
      if ((cmCompiledGeneratorExpression *)local_270._0_8_ !=
          (cmCompiledGeneratorExpression *)(local_270 + 0x10)) {
        operator_delete((void *)local_270._0_8_,CONCAT71(local_270._17_7_,local_270[0x10]) + 1);
      }
      cmGeneratorExpression::cmGeneratorExpression(&local_2b0,local_3a8);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_270,(string *)&local_2b0);
      local_3c0.x_ = (cmCompiledGeneratorExpression *)local_270._0_8_;
      local_270._0_8_ = (pointer)0x0;
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)local_270);
      local_270._0_8_ = local_270 + 0x10;
      local_270._8_8_ = 0;
      local_270[0x10] = '\0';
      pcVar8 = cmCompiledGeneratorExpression::Evaluate
                         (local_3c0.x_,this->LocalGenerator,local_3a0,false,local_328,
                          (cmGeneratorExpressionDAGChecker *)local_f8,(string *)local_270);
      std::__cxx11::string::string((string *)&local_358,pcVar8,(allocator *)&local_2f0);
      if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
        operator_delete((void *)local_270._0_8_,CONCAT71(local_270._17_7_,local_270[0x10]) + 1);
      }
      cmSystemTools::ExpandListArgument(&local_358,&local_378,false);
      if ((local_3c0.x_)->HadHeadSensitiveCondition == true) {
        local_3b0->HadHeadSensitiveCondition = true;
      }
      item = local_378.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      if (local_378.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_378.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          CheckCMP0004(&local_398,this,item);
          __n = local_398._M_string_length;
          pcVar1 = this->Target;
          sVar2 = (pcVar1->Name)._M_string_length;
          if (local_398._M_string_length == sVar2) {
            if ((local_398._M_string_length == 0) ||
               (iVar5 = bcmp(local_398._M_dataplus._M_p,(pcVar1->Name)._M_dataplus._M_p,
                             local_398._M_string_length), iVar5 == 0)) goto LAB_003eab51;
LAB_003eac31:
            pcVar13 = FindTargetToLink(this,&local_398);
            bVar15 = true;
            if (local_358._M_string_length == (local_3b8._M_current)->_M_string_length) {
              if (local_358._M_string_length == 0) {
                bVar15 = false;
              }
              else {
                iVar5 = bcmp(local_358._M_dataplus._M_p,((local_3b8._M_current)->_M_dataplus)._M_p,
                             local_358._M_string_length);
                bVar15 = iVar5 != 0;
              }
            }
            cmLinkImplItem::cmLinkImplItem
                      ((cmLinkImplItem *)local_270,&local_398,pcVar13,local_3a8,bVar15);
            std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::
            emplace_back<cmLinkImplItem>
                      ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_3b0,
                       (cmLinkImplItem *)local_270);
            cmListFileBacktrace::~cmListFileBacktrace(&local_248);
            if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
              operator_delete((void *)local_270._0_8_,CONCAT71(local_270._17_7_,local_270[0x10]) + 1
                             );
            }
            iVar5 = 0;
          }
          else {
            if (local_398._M_string_length != 0) goto LAB_003eac31;
LAB_003eab51:
            iVar5 = 7;
            if ((__n == sVar2) &&
               ((__n == 0 ||
                (iVar6 = bcmp(local_398._M_dataplus._M_p,(pcVar1->Name)._M_dataplus._M_p,__n),
                iVar6 == 0)))) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
              PVar7 = cmPolicies::PolicyMap::Get(local_320,CMP0038);
              t = FATAL_ERROR;
              if (PVar7 == OLD) {
                bVar3 = true;
                bVar15 = true;
              }
              else {
                if (PVar7 == WARN) {
                  cmPolicies::GetPolicyWarning_abi_cxx11_
                            ((string *)&local_2f0,(cmPolicies *)0x26,id);
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_270,local_2f0.Context.Name._M_dataplus._M_p,
                                      local_2f0.Context.Name._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2f0.Context.Name._M_dataplus._M_p != &local_2f0.Context.Name.field_2)
                  {
                    operator_delete(local_2f0.Context.Name._M_dataplus._M_p,
                                    local_2f0.Context.Name.field_2._M_allocated_capacity + 1);
                  }
                  bVar3 = false;
                  t = AUTHOR_WARNING;
                }
                else {
                  bVar3 = true;
                }
                bVar15 = false;
              }
              if (!bVar15) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_270,"Target \"",8);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_270,(this->Target->Name)._M_dataplus._M_p,
                                    (this->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,"\" links to itself.",0x12);
                pcVar10 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
                std::__cxx11::stringbuf::str();
                GetBacktrace(&local_2f0,this);
                cmake::IssueMessage(pcVar10,t,&local_310,&local_2f0,false);
                cmListFileBacktrace::~cmListFileBacktrace(&local_2f0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_310._M_dataplus._M_p != &local_310.field_2) {
                  operator_delete(local_310._M_dataplus._M_p,
                                  local_310.field_2._M_allocated_capacity + 1);
                }
                if (bVar3) {
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
                  std::ios_base::~ios_base(local_200);
                  iVar5 = 1;
                  goto LAB_003eacdb;
                }
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
              std::ios_base::~ios_base(local_200);
            }
          }
LAB_003eacdb:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
          }
          if ((iVar5 != 7) && (iVar5 != 0)) goto LAB_003eae51;
          item = item + 1;
        } while (item != local_378.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      }
      iVar5 = 5;
LAB_003eae51:
      if (iVar5 == 5) {
        psVar4 = &(local_3c0.x_)->SeenTargetProperties;
        for (p_Var11 = ((local_3c0.x_)->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header.
                       _M_header._M_left;
            (_Rb_tree_header *)p_Var11 != &(psVar4->_M_t)._M_impl.super__Rb_tree_header;
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
          pcVar8 = cmTarget::GetProperty(this->Target,(string *)(p_Var11 + 1));
          if (pcVar8 == (char *)0x0) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      (local_318,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var11 + 1));
          }
        }
        iVar5 = 0;
        cmCompiledGeneratorExpression::GetMaxLanguageStandard(local_3c0.x_,this,local_338);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
      }
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_3c0);
      cmGeneratorExpression::~cmGeneratorExpression(&local_2b0);
      cmListFileBacktrace::~cmListFileBacktrace(&local_78);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_p != &local_c0) {
        operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._8_8_ != &local_e0) {
        operator_delete((void *)local_f8._8_8_,local_e0._0_8_ + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_378);
      if (iVar5 != 0) {
        return;
      }
      local_3a8 = local_3a8 + 1;
      cVar16.End._M_current = local_330._M_current;
      cVar16.Begin._M_current = local_3b8._M_current + 1;
    } while (local_3b8._M_current + 1 != local_330._M_current);
  }
  local_330 = cVar16.End._M_current;
  local_3b8 = cVar16.Begin._M_current;
  pcVar10 = cmMakefile::GetCMakeInstance(this->Makefile);
  cmake::GetDebugConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2b0,pcVar10);
  if (local_3a0->_M_string_length == 0) {
    cVar14 = OPTIMIZED_LibraryType;
  }
  else {
    cmsys::SystemTools::UpperCase((string *)local_270,local_3a0);
    _Var12 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (local_2b0.Backtrace.Context.Name._M_dataplus._M_p,
                        local_2b0.Backtrace.Context.Name._M_string_length,local_270);
    if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
      operator_delete((void *)local_270._0_8_,CONCAT71(local_270._17_7_,local_270[0x10]) + 1);
    }
    cVar14 = (_Var12._M_current ==
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_2b0.Backtrace.Context.Name._M_string_length) + DEBUG_LibraryType;
  }
  pcVar1 = this->Target;
  item_00 = (pcVar1->OriginalLinkLibraries).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (item_00 !=
      (pcVar1->OriginalLinkLibraries).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_3b0 = (cmOptionalLinkImplementation *)
                &(local_3b0->super_cmLinkImplementation).super_cmLinkImplementationLibraries.
                 WrongConfigLibraries;
    do {
      if ((item_00->second != GENERAL_LibraryType) && (item_00->second != cVar14)) {
        CheckCMP0004((string *)local_f8,this,&item_00->first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._8_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(this->Target->Name)._M_string_length) {
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_f8._8_8_ !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0) &&
             (iVar5 = bcmp((void *)local_f8._0_8_,(this->Target->Name)._M_dataplus._M_p,
                           local_f8._8_8_), iVar5 != 0)) {
LAB_003eb0b0:
            pcVar13 = FindTargetToLink(this,(string *)local_f8);
            local_270._0_8_ = local_270 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_270,local_f8._0_8_,(char *)(local_f8._8_8_ + local_f8._0_8_))
            ;
            local_250 = pcVar13;
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_3b0,
                       (cmLinkItem *)local_270);
            if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
              operator_delete((void *)local_270._0_8_,CONCAT71(local_270._17_7_,local_270[0x10]) + 1
                             );
            }
          }
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_f8._8_8_ !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0) goto LAB_003eb0b0;
        if ((cmGeneratorExpressionDAGChecker *)local_f8._0_8_ !=
            (cmGeneratorExpressionDAGChecker *)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
        }
      }
      item_00 = item_00 + 1;
    } while (item_00 !=
             (pcVar1->OriginalLinkLibraries).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2b0);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkImplementationLibraries(
  const std::string& config,
  cmOptionalLinkImplementation& impl,
  cmGeneratorTarget const* head) const
{
  cmStringRange entryRange =
      this->Target->GetLinkImplementationEntries();
  cmBacktraceRange btRange =
      this->Target->GetLinkImplementationBacktraces();
  cmBacktraceRange::const_iterator btIt = btRange.begin();
  // Collect libraries directly linked in this configuration.
  for (cmStringRange::const_iterator le = entryRange.begin(),
      end = entryRange.end(); le != end; ++le, ++btIt)
    {
    std::vector<std::string> llibs;
    cmGeneratorExpressionDAGChecker dagChecker(
                                        this->GetName(),
                                        "LINK_LIBRARIES", 0, 0);
    cmGeneratorExpression ge(*btIt);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> const cge =
      ge.Parse(*le);
    std::string const evaluated =
      cge->Evaluate(this->LocalGenerator, config, false, head, &dagChecker);
    cmSystemTools::ExpandListArgument(evaluated, llibs);
    if(cge->GetHadHeadSensitiveCondition())
      {
      impl.HadHeadSensitiveCondition = true;
      }

    for(std::vector<std::string>::const_iterator li = llibs.begin();
        li != llibs.end(); ++li)
      {
      // Skip entries that resolve to the target itself or are empty.
      std::string name = this->CheckCMP0004(*li);
      if(name == this->GetName() || name.empty())
        {
        if(name == this->GetName())
          {
          bool noMessage = false;
          cmake::MessageType messageType = cmake::FATAL_ERROR;
          std::ostringstream e;
          switch(this->GetPolicyStatusCMP0038())
            {
            case cmPolicies::WARN:
              {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0038) << "\n";
              messageType = cmake::AUTHOR_WARNING;
              }
              break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
            }

          if(!noMessage)
            {
            e << "Target \"" << this->GetName() << "\" links to itself.";
            this->LocalGenerator->GetCMakeInstance()->IssueMessage(
              messageType, e.str(), this->GetBacktrace());
            if (messageType == cmake::FATAL_ERROR)
              {
              return;
              }
            }
          }
        continue;
        }

      // The entry is meant for this configuration.
      impl.Libraries.push_back(
        cmLinkImplItem(name, this->FindTargetToLink(name),
                       *btIt, evaluated != *le));
      }

    std::set<std::string> const& seenProps = cge->GetSeenTargetProperties();
    for (std::set<std::string>::const_iterator it = seenProps.begin();
        it != seenProps.end(); ++it)
      {
      if (!this->GetProperty(*it))
        {
        this->LinkImplicitNullProperties.insert(*it);
        }
      }
    cge->GetMaxLanguageStandard(this,
                                this->MaxLanguageStandards);
    }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();

  cmTargetLinkLibraryType linkType =
      CMP0003_ComputeLinkType(config, debugConfigs);
  cmTarget::LinkLibraryVectorType const& oldllibs =
    this->Target->GetOriginalLinkLibraries();
  for(cmTarget::LinkLibraryVectorType::const_iterator li = oldllibs.begin();
      li != oldllibs.end(); ++li)
    {
    if(li->second != GENERAL_LibraryType && li->second != linkType)
      {
      std::string name = this->CheckCMP0004(li->first);
      if(name == this->GetName() || name.empty())
        {
        continue;
        }
      // Support OLD behavior for CMP0003.
      impl.WrongConfigLibraries.push_back(
        cmLinkItem(name, this->FindTargetToLink(name)));
      }
    }
}